

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

int quicly_sendbuf_write_vec(quicly_stream_t *stream,quicly_sendbuf_t *sb,quicly_sendbuf_vec_t *vec)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *in_RDX;
  long *in_RSI;
  size_t new_capacity;
  quicly_sendbuf_vec_t *new_entries;
  quicly_stream_t *in_stack_ffffffffffffffc8;
  quicly_stream_t *pqVar5;
  
  if ((ulong)in_RSI[2] < (ulong)in_RSI[1]) {
    __assert_fail("sb->vecs.size <= sb->vecs.capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0x9c,
                  "int quicly_sendbuf_write_vec(quicly_stream_t *, quicly_sendbuf_t *, quicly_sendbuf_vec_t *)"
                 );
  }
  if (in_RSI[1] == in_RSI[2]) {
    if (in_RSI[2] == 0) {
      pqVar5 = (quicly_stream_t *)0x4;
    }
    else {
      pqVar5 = (quicly_stream_t *)(in_RSI[2] << 1);
    }
    in_stack_ffffffffffffffc8 = pqVar5;
    pvVar3 = realloc((void *)*in_RSI,(long)pqVar5 * 0x18);
    if (pvVar3 == (void *)0x0) {
      return 0x201;
    }
    *in_RSI = (long)pvVar3;
    in_RSI[2] = (long)pqVar5;
  }
  lVar1 = in_RSI[1];
  in_RSI[1] = lVar1 + 1;
  puVar4 = (undefined8 *)(*in_RSI + lVar1 * 0x18);
  *puVar4 = *in_RDX;
  puVar4[1] = in_RDX[1];
  puVar4[2] = in_RDX[2];
  in_RSI[4] = in_RDX[1] + in_RSI[4];
  iVar2 = quicly_stream_sync_sendbuf(in_stack_ffffffffffffffc8,0);
  return iVar2;
}

Assistant:

int quicly_sendbuf_write_vec(quicly_stream_t *stream, quicly_sendbuf_t *sb, quicly_sendbuf_vec_t *vec)
{
    assert(sb->vecs.size <= sb->vecs.capacity);

    if (sb->vecs.size == sb->vecs.capacity) {
        quicly_sendbuf_vec_t *new_entries;
        size_t new_capacity = sb->vecs.capacity == 0 ? 4 : sb->vecs.capacity * 2;
        if ((new_entries = realloc(sb->vecs.entries, new_capacity * sizeof(*sb->vecs.entries))) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        sb->vecs.entries = new_entries;
        sb->vecs.capacity = new_capacity;
    }
    sb->vecs.entries[sb->vecs.size++] = *vec;
    sb->bytes_written += vec->len;

    return quicly_stream_sync_sendbuf(stream, 1);
}